

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

value * __thiscall
mjs::interpreter::impl::operator()(value *__return_storage_ptr__,impl *this,binary_expression *e)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  token_type tVar4;
  void *pvVar5;
  object *this_00;
  uint *puVar6;
  long *plVar7;
  void *pvVar8;
  undefined8 *puVar9;
  wostream *pwVar10;
  char *pcVar11;
  native_error_exception *pnVar12;
  value o;
  value l;
  value r;
  value l_1;
  undefined1 local_2c8 [32];
  undefined1 local_2a8 [8];
  gc_heap_ptr_untyped local_2a0 [2];
  undefined1 local_280 [40];
  undefined1 local_258 [40];
  undefined1 local_230 [16];
  wstring_view local_220 [2];
  wstring_view local_200;
  gc_heap_ptr_untyped local_1f0;
  undefined1 local_1e0 [376];
  wstring_view local_68;
  value local_58;
  
  if (e->op_ == comma) {
    eval((value *)local_1e0,this,
         (e->lhs_)._M_t.
         super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
         super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
         super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
    get_value(&local_58,this,(value *)local_1e0);
    value::destroy(&local_58);
    value::destroy((value *)local_1e0);
    eval((value *)local_1e0,this,
         (e->rhs_)._M_t.
         super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
         super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
         super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
    get_value(__return_storage_ptr__,this,(value *)local_1e0);
    value::destroy((value *)local_1e0);
    return __return_storage_ptr__;
  }
  iVar3 = operator_precedence(e->op_);
  if (iVar3 == 0xf) {
    eval((value *)local_1e0,this,
         (e->lhs_)._M_t.
         super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
         super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
         super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
    eval((value *)local_280,this,
         (e->rhs_)._M_t.
         super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
         super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
         super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
    get_value(__return_storage_ptr__,this,(value *)local_280);
    value::destroy((value *)local_280);
    if (e->op_ != equal) {
      get_value((value *)local_280,this,(value *)local_1e0);
      tVar4 = without_assignment(e->op_);
      do_binary_op((value *)local_258,this,tVar4,(value *)local_280,__return_storage_ptr__);
      value::operator=(__return_storage_ptr__,(value *)local_258);
      value::destroy((value *)local_258);
      value::destroy((value *)local_280);
    }
    put_value(this,(value *)local_1e0,__return_storage_ptr__);
    value::destroy((value *)local_1e0);
    return __return_storage_ptr__;
  }
  eval((value *)local_1e0,this,
       (e->lhs_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
       _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
       super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
  get_value((value *)local_280,this,(value *)local_1e0);
  value::destroy((value *)local_1e0);
  if (((e->op_ == andand) && (bVar2 = to_boolean((value *)local_280), !bVar2)) ||
     ((e->op_ == oror && (bVar2 = to_boolean((value *)local_280), bVar2)))) {
    value::value(__return_storage_ptr__,(value *)local_280);
    goto LAB_00125c37;
  }
  eval((value *)local_1e0,this,
       (e->rhs_)._M_t.super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
       _M_t.super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
       super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl);
  get_value((value *)local_258,this,(value *)local_1e0);
  value::destroy((value *)local_1e0);
  uVar1 = local_258._0_4_;
  tVar4 = e->op_;
  if (tVar4 - andand < 2) {
    value::value(__return_storage_ptr__,(value *)local_258);
  }
  else if ((int)tVar4 < 0x52) {
    if ((tVar4 == dot) || (tVar4 == lbracket)) {
      make_reference(__return_storage_ptr__,this,(value *)local_280,(value *)local_258);
    }
    else {
LAB_001259d8:
      do_binary_op(__return_storage_ptr__,this,tVar4,(value *)local_280,(value *)local_258);
    }
  }
  else if (tVar4 == in_) {
    if (local_258._0_4_ != object) {
      std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1e0);
      pcVar11 = string_value(local_258._0_4_);
      pwVar10 = std::operator<<((wostream *)local_1e0,pcVar11);
      std::operator<<(pwVar10," is not an object");
      pnVar12 = (native_error_exception *)__cxa_allocate_exception(0x58);
      stack_trace_abi_cxx11_((wstring *)(local_2c8 + 0x20),this);
      local_220[0]._M_len = (size_t)local_2a0[0].heap_;
      std::__cxx11::wstringbuf::str();
      local_230._8_8_ = local_2c8._0_8_;
      native_error_exception::native_error_exception
                (pnVar12,type,local_220,(wstring_view *)local_230);
      __cxa_throw(pnVar12,&native_error_exception::typeinfo,
                  native_error_exception::~native_error_exception);
    }
    this_00 = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_258 + 8));
    to_string((mjs *)(local_2c8 + 0x20),this->heap_,(value *)local_280);
    puVar6 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_2c8 + 0x20));
    local_1e0._8_8_ = puVar6 + 1;
    local_1e0._0_8_ = ZEXT48(*puVar6);
    bVar2 = object::has_property(this_00,(wstring_view *)local_1e0);
    __return_storage_ptr__->type_ = boolean;
    (__return_storage_ptr__->field_1).b_ = bVar2;
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_2c8 + 0x20));
  }
  else {
    if (tVar4 != instanceof_) goto LAB_001259d8;
    bVar2 = true;
    if (local_258._0_4_ == object) {
      pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_258 + 8));
      if (*(int *)((long)pvVar5 + 0x14) == 0) {
        local_230._0_8_ = (gc_heap *)0x0;
        local_230._8_8_ = local_230._8_8_ & 0xffffffff00000000;
      }
      else {
        gc_heap::unsafe_create_from_position<mjs::object>
                  ((gc_heap *)local_230,(uint32_t)*(undefined8 *)((long)pvVar5 + 8));
      }
      pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_230);
      plVar7 = (long *)gc_heap_ptr_untyped::get(&(this->global_).super_gc_heap_ptr_untyped);
      (**(code **)(*plVar7 + 0x60))(&local_1f0,plVar7);
      pvVar8 = gc_heap_ptr_untyped::get(&local_1f0);
      bVar2 = pvVar5 != pvVar8;
    }
    if (uVar1 == object) {
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1f0);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_230);
    }
    if (bVar2) {
      std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1e0);
      pcVar11 = string_value(local_258._0_4_);
      pwVar10 = std::operator<<((wostream *)local_1e0,pcVar11);
      std::operator<<(pwVar10," is not an object");
      pnVar12 = (native_error_exception *)__cxa_allocate_exception(0x58);
      stack_trace_abi_cxx11_((wstring *)(local_2c8 + 0x20),this);
      local_220[0]._M_len = (size_t)local_2a0[0].heap_;
      std::__cxx11::wstringbuf::str();
      local_200._M_str = (wchar_t *)local_2c8._0_8_;
      native_error_exception::native_error_exception(pnVar12,type,local_220,&local_200);
      __cxa_throw(pnVar12,&native_error_exception::typeinfo,
                  native_error_exception::~native_error_exception);
    }
    if (local_280._0_4_ == object) {
      if (local_258._0_4_ != object) {
LAB_00125c56:
        __assert_fail("type_ == value_type::object",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h"
                      ,0x46,"const object_ptr &mjs::value::object_value() const");
      }
      puVar9 = (undefined8 *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_258 + 8));
      local_1e0._0_8_ = (gc_heap *)0x9;
      local_1e0._8_8_ = L"prototype";
      (**(code **)*puVar9)(local_2c8 + 0x20,puVar9);
      if (local_2a8._0_4_ != object) {
        std::__cxx11::wostringstream::wostringstream((wostringstream *)local_1e0);
        pwVar10 = std::operator<<((wostream *)local_1e0,"Function has non-object prototype of type "
                                 );
        pcVar11 = string_value(local_2a8._0_4_);
        pwVar10 = std::operator<<(pwVar10,pcVar11);
        std::operator<<(pwVar10," in instanceof check");
        pnVar12 = (native_error_exception *)__cxa_allocate_exception(0x58);
        stack_trace_abi_cxx11_((wstring *)local_2c8,this);
        local_200._M_str = (wchar_t *)local_2c8._0_8_;
        std::__cxx11::wstringbuf::str();
        local_68._M_len = (size_t)local_220[0]._M_str;
        local_68._M_str = (wchar_t *)local_220[0]._M_len;
        native_error_exception::native_error_exception(pnVar12,type,&local_200,&local_68);
        __cxa_throw(pnVar12,&native_error_exception::typeinfo,
                    native_error_exception::~native_error_exception);
      }
      if (local_280._0_4_ != object) goto LAB_00125c56;
      pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_280 + 8));
      if (*(int *)((long)pvVar5 + 0x14) == 0) {
        local_1e0._0_8_ = (gc_heap *)0x0;
        local_1e0._8_8_ = local_1e0._8_8_ & 0xffffffff00000000;
      }
      else {
        gc_heap::unsafe_create_from_position<mjs::object>
                  ((gc_heap *)local_1e0,(uint32_t)*(undefined8 *)((long)pvVar5 + 8));
      }
      if ((gc_heap *)local_1e0._0_8_ != (gc_heap *)0x0) {
        do {
          pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_1e0);
          if (local_2a8._0_4_ != object) goto LAB_00125c56;
          pvVar8 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_2a8 + 8));
          if (pvVar5 == pvVar8) {
            bVar2 = true;
            goto LAB_00125c0d;
          }
          pvVar5 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_1e0);
          if (*(int *)((long)pvVar5 + 0x14) == 0) {
            local_2c8._0_8_ = (gc_heap *)0x0;
            local_2c8._8_4_ = 0;
          }
          else {
            gc_heap::unsafe_create_from_position<mjs::object>
                      ((gc_heap *)local_2c8,(uint32_t)*(undefined8 *)((long)pvVar5 + 8));
          }
          gc_heap_ptr_untyped::operator=
                    ((gc_heap_ptr_untyped *)local_1e0,(gc_heap_ptr_untyped *)local_2c8);
          gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_2c8);
        } while ((gc_heap *)local_1e0._0_8_ != (gc_heap *)0x0);
      }
      bVar2 = false;
LAB_00125c0d:
      __return_storage_ptr__->type_ = boolean;
      (__return_storage_ptr__->field_1).b_ = bVar2;
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_1e0);
      value::destroy((value *)(local_2c8 + 0x20));
    }
    else {
      __return_storage_ptr__->type_ = boolean;
      (__return_storage_ptr__->field_1).b_ = false;
    }
  }
  value::destroy((value *)local_258);
LAB_00125c37:
  value::destroy((value *)local_280);
  return __return_storage_ptr__;
}

Assistant:

value operator()(const binary_expression& e) {
        if (e.op() == token_type::comma) {
            (void)get_value(eval(e.lhs()));;
            return get_value(eval(e.rhs()));
        }
        if (operator_precedence(e.op()) == assignment_precedence) {
            auto l = eval(e.lhs());
            auto r = get_value(eval(e.rhs()));
            if (e.op() != token_type::equal) {
                auto lval = get_value(l);
                r = do_binary_op(without_assignment(e.op()), lval, r);
            }
            put_value(l, r);
            return r;
        }

        auto l = get_value(eval(e.lhs()));
        if ((e.op() == token_type::andand && !to_boolean(l)) || (e.op() == token_type::oror && to_boolean(l))) {
            return l;
        }
        auto r = get_value(eval(e.rhs()));
        if (e.op() == token_type::andand || e.op() == token_type::oror) {
            return r;
        } else if (is_reference_op(e.op())) {
            return make_reference(l, r);
        } else if (e.op() == token_type::in_) {
            if (r.type() != value_type::object) {
                std::wostringstream woss;
                woss << r.type() << " is not an object";
                throw native_error_exception{native_error_type::type, stack_trace(), woss.str()};
            }
            return value{r.object_value()->has_property(to_string(heap_, l).view())};
        } else if (e.op() == token_type::instanceof_) {
            if (r.type() != value_type::object || r.object_value()->prototype().get() != global_->function_prototype().get()) {
                std::wostringstream woss;
                woss << r.type() << " is not an object";
                throw native_error_exception{native_error_type::type, stack_trace(), woss.str()};
            }
            // ES3, 15.3.5.3 [[HasInstance]] (only implemented for Function objects)
            if (l.type() != value_type::object) {
                return value{false};
            }
            auto o = r.object_value()->get(L"prototype");
            if (o.type() != value_type::object) {
                std::wostringstream woss;
                woss << "Function has non-object prototype of type " << o.type() << " in instanceof check";
                throw native_error_exception{native_error_type::type, stack_trace(), woss.str()};
            }
            auto v = l.object_value()->prototype();
            for (;;) {
                if (!v) {
                    return value{false};
                }
                if (v.get() == o.object_value().get()) { // TODO: handle joined objects (ES3, 13.1.2)
                    return value{true};
                }
                v = v->prototype();
            }

        }
        return do_binary_op(e.op(), l, r);
    }